

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O1

void __thiscall QPDFJob::parseRotationParameter(QPDFJob *this,string *parameter)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  mapped_type *pmVar7;
  undefined8 extraout_RAX;
  int iVar8;
  string angle_str;
  string range;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  char *local_88;
  char *local_80;
  char local_78;
  undefined7 uStack_77;
  key_type local_68;
  vector<int,_std::allocator<int>_> local_48;
  
  local_88 = &local_78;
  local_80 = (char *)0x0;
  local_78 = '\0';
  paVar1 = &local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_68._M_dataplus._M_p = (pointer)paVar1;
  lVar6 = std::__cxx11::string::find((char)parameter,0x3a);
  if (lVar6 == -1) {
    std::__cxx11::string::_M_assign((string *)&local_88);
  }
  else {
    if (lVar6 != 0) {
      std::__cxx11::string::substr((ulong)&local_a8,(ulong)parameter);
      std::__cxx11::string::operator=((string *)&local_88,(string *)&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
    }
    if (lVar6 + 1U < parameter->_M_string_length) {
      std::__cxx11::string::substr((ulong)&local_a8,(ulong)parameter);
      std::__cxx11::string::operator=((string *)&local_68,(string *)&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
    }
  }
  iVar8 = 0;
  if (local_80 != (char *)0x0) {
    cVar2 = *local_88;
    if ((cVar2 == '-') || (cVar2 == '+')) {
      std::__cxx11::string::substr((ulong)&local_a8,(ulong)&local_88);
      std::__cxx11::string::operator=((string *)&local_88,(string *)&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      iVar8 = (uint)(cVar2 == '+') * 2 + -1;
    }
    else {
      iVar8 = 0;
      if (9 < (byte)(cVar2 - 0x30U)) {
        iVar8 = 0;
        std::__cxx11::string::_M_replace((ulong)&local_88,0,local_80,0x27dc90);
      }
    }
  }
  if (local_68._M_string_length == 0) {
    std::__cxx11::string::_M_replace((ulong)&local_68,0,(char *)0x0,0x268009);
  }
  QUtil::parse_numrange(&local_48,local_68._M_dataplus._M_p,0);
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  iVar4 = QUtil::string_to_int(local_88);
  iVar4 = iVar4 % 0x168;
  uVar5 = iVar4 * -0x5b05b05b + 0x2d82d82;
  if ((uVar5 >> 1 | (uint)((uVar5 & 1) != 0) << 0x1f) < 0x2d82d83) {
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFJob::RotationSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFJob::RotationSpec>_>_>
             ::operator[](&((this->m).
                            super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                           ->rotations,&local_68);
    iVar3 = -iVar4;
    if (iVar8 != -1) {
      iVar3 = iVar4;
    }
    pmVar7->angle = iVar3;
    pmVar7->relative = iVar8 != 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,
                      CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                               local_68.field_2._M_local_buf[0]) + 1);
    }
    if (local_88 != &local_78) {
      operator_delete(local_88,CONCAT71(uStack_77,local_78) + 1);
    }
    return;
  }
  std::operator+(&local_a8,"invalid parameter to rotate (angle must be a multiple of 90): ",
                 parameter);
  usage(&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  if (local_88 != &local_78) {
    operator_delete(local_88,CONCAT71(uStack_77,local_78) + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void
QPDFJob::parseRotationParameter(std::string const& parameter)
{
    std::string angle_str;
    std::string range;
    size_t colon = parameter.find(':');
    int relative = 0;
    if (colon != std::string::npos) {
        if (colon > 0) {
            angle_str = parameter.substr(0, colon);
        }
        if (colon + 1 < parameter.length()) {
            range = parameter.substr(colon + 1);
        }
    } else {
        angle_str = parameter;
    }
    if (angle_str.length() > 0) {
        char first = angle_str.at(0);
        if ((first == '+') || (first == '-')) {
            relative = ((first == '+') ? 1 : -1);
            angle_str = angle_str.substr(1);
        } else if (!util::is_digit(angle_str.at(0))) {
            angle_str = "";
        }
    }
    if (range.empty()) {
        range = "1-z";
    }
    try {
        QUtil::parse_numrange(range.c_str(), 0);
    } catch (std::runtime_error const&) {
        usage("invalid parameter to rotate: " + parameter);
    }
    int angle = QUtil::string_to_int(angle_str.c_str()) % 360;
    if (angle % 90 != 0) {
        usage("invalid parameter to rotate (angle must be a multiple of 90): " + parameter);
    }
    if (relative == -1) {
        angle = -angle;
    }
    m->rotations[range] = RotationSpec(angle, (relative != 0));
}